

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_1a3010::CheckType(ExpressionContext *ctx,ExprBase *expr,VmValue *value)

{
  bool bVar1;
  undefined1 local_30 [8];
  VmType exprType;
  VmValue *value_local;
  ExprBase *expr_local;
  ExpressionContext *ctx_local;
  
  exprType.structType = (TypeBase *)value;
  _local_30 = GetVmType(ctx,expr->type);
  bVar1 = VmType::operator==((VmType *)local_30,(VmType *)&(exprType.structType)->name);
  if (!bVar1) {
    __assert_fail("exprType == value->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1a,
                  "VmValue *(anonymous namespace)::CheckType(ExpressionContext &, ExprBase *, VmValue *)"
                 );
  }
  if ((char *)exprType._0_8_ == ((exprType.structType)->name).end) {
    return (VmValue *)exprType.structType;
  }
  __assert_fail("exprType.structType == value->type.structType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x1b,
                "VmValue *(anonymous namespace)::CheckType(ExpressionContext &, ExprBase *, VmValue *)"
               );
}

Assistant:

VmValue* CheckType(ExpressionContext &ctx, ExprBase* expr, VmValue *value)
	{
		VmType exprType = GetVmType(ctx, expr->type);

		(void)exprType;

		assert(exprType == value->type);
		assert(exprType.structType == value->type.structType);

		return value;
	}